

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Set_Charmap(FT_Face face,FT_CharMap charmap)

{
  FT_CharMap *ppFVar1;
  FT_Long FVar2;
  FT_CharMap *limit;
  FT_CharMap *cur;
  FT_CharMap charmap_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else {
    limit = face->charmaps;
    if ((limit == (FT_CharMap *)0x0) || (charmap == (FT_CharMap)0x0)) {
      face_local._4_4_ = 0x26;
    }
    else {
      ppFVar1 = limit + face->num_charmaps;
      for (; limit < ppFVar1; limit = limit + 1) {
        if ((*limit == charmap) && (FVar2 = FT_Get_CMap_Format(charmap), FVar2 != 0xe)) {
          face->charmap = *limit;
          return 0;
        }
      }
      face_local._4_4_ = 6;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Set_Charmap( FT_Face     face,
                  FT_CharMap  charmap )
  {
    FT_CharMap*  cur;
    FT_CharMap*  limit;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    cur = face->charmaps;
    if ( !cur || !charmap )
      return FT_THROW( Invalid_CharMap_Handle );

    limit = cur + face->num_charmaps;

    for ( ; cur < limit; cur++ )
    {
      if ( cur[0] == charmap                    &&
           FT_Get_CMap_Format ( charmap ) != 14 )
      {
        face->charmap = cur[0];
        return FT_Err_Ok;
      }
    }

    return FT_THROW( Invalid_Argument );
  }